

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int VP8LDecodeImage(VP8LDecoder *dec)

{
  long lVar1;
  int iVar2;
  undefined4 *in_RDI;
  VP8Io *unaff_retaddr;
  WebPDecParams *params;
  VP8Io *io;
  VP8Io *in_stack_00000030;
  VP8LDecoder *in_stack_00000038;
  ProcessRowsFunc in_stack_00000088;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  uint32_t *in_stack_000000a0;
  VP8LDecoder *in_stack_000000a8;
  VP8LColorCache *in_stack_ffffffffffffffd8;
  VP8LDecoder *dec_00;
  undefined4 in_stack_fffffffffffffff8;
  WEBP_CSP_MODE in_stack_fffffffffffffffc;
  
  if (in_RDI == (undefined4 *)0x0) {
    return 0;
  }
  lVar1 = *(long *)(in_RDI + 2);
  dec_00 = *(VP8LDecoder **)(lVar1 + 0x38);
  if (in_RDI[1] != 0) {
    *(undefined8 *)(in_RDI + 4) = *(undefined8 *)dec_00;
    iVar2 = WebPIoInitFromOptions
                      ((WebPDecoderOptions *)params,unaff_retaddr,in_stack_fffffffffffffffc);
    if (iVar2 == 0) {
      *in_RDI = 2;
      goto LAB_0011428e;
    }
    iVar2 = AllocateInternalBuffers32b
                      ((VP8LDecoder *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int)((ulong)in_RDI >> 0x20));
    if ((iVar2 == 0) ||
       ((*(int *)(lVar1 + 0x88) != 0 &&
        (iVar2 = AllocateAndInitRescaler(in_stack_00000038,in_stack_00000030), iVar2 == 0))))
    goto LAB_0011428e;
    if ((*(int *)(lVar1 + 0x88) != 0) ||
       (iVar2 = WebPIsPremultipliedMode(**(WEBP_CSP_MODE **)(in_RDI + 4)), iVar2 != 0)) {
      WebPInitAlphaProcessing();
    }
    iVar2 = WebPIsRGBMode(**(WEBP_CSP_MODE **)(in_RDI + 4));
    if ((iVar2 == 0) && (WebPInitConvertARGBToYUV(), *(long *)(*(long *)(in_RDI + 4) + 0x28) != 0))
    {
      WebPInitAlphaProcessing();
    }
    if ((((in_RDI[0x14] != 0) && (0 < (int)in_RDI[0x26])) && (*(long *)(in_RDI + 0x2c) == 0)) &&
       (iVar2 = VP8LColorCacheInit(in_stack_ffffffffffffffd8,0), iVar2 == 0)) {
      *in_RDI = 1;
      goto LAB_0011428e;
    }
    in_RDI[1] = 0;
  }
  iVar2 = DecodeImageData(in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                          in_stack_00000094,in_stack_00000088);
  if (iVar2 != 0) {
    *(undefined4 *)&dec_00->argb_cache_ = in_RDI[0x25];
    return 1;
  }
LAB_0011428e:
  VP8LClear(dec_00);
  return 0;
}

Assistant:

int VP8LDecodeImage(VP8LDecoder* const dec) {
  VP8Io* io = NULL;
  WebPDecParams* params = NULL;

  if (dec == NULL) return 0;

  assert(dec->hdr_.huffman_tables_ != NULL);
  assert(dec->hdr_.htree_groups_ != NULL);
  assert(dec->hdr_.num_htree_groups_ > 0);

  io = dec->io_;
  assert(io != NULL);
  params = (WebPDecParams*)io->opaque;
  assert(params != NULL);

  // Initialization.
  if (dec->state_ != READ_DATA) {
    dec->output_ = params->output;
    assert(dec->output_ != NULL);

    if (!WebPIoInitFromOptions(params->options, io, MODE_BGRA)) {
      dec->status_ = VP8_STATUS_INVALID_PARAM;
      goto Err;
    }

    if (!AllocateInternalBuffers32b(dec, io->width)) goto Err;

#if !defined(WEBP_REDUCE_SIZE)
    if (io->use_scaling && !AllocateAndInitRescaler(dec, io)) goto Err;
#else
    if (io->use_scaling) {
      dec->status_ = VP8_STATUS_INVALID_PARAM;
      goto Err;
    }
#endif
    if (io->use_scaling || WebPIsPremultipliedMode(dec->output_->colorspace)) {
      // need the alpha-multiply functions for premultiplied output or rescaling
      WebPInitAlphaProcessing();
    }

    if (!WebPIsRGBMode(dec->output_->colorspace)) {
      WebPInitConvertARGBToYUV();
      if (dec->output_->u.YUVA.a != NULL) WebPInitAlphaProcessing();
    }
    if (dec->incremental_) {
      if (dec->hdr_.color_cache_size_ > 0 &&
          dec->hdr_.saved_color_cache_.colors_ == NULL) {
        if (!VP8LColorCacheInit(&dec->hdr_.saved_color_cache_,
                                dec->hdr_.color_cache_.hash_bits_)) {
          dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
          goto Err;
        }
      }
    }
    dec->state_ = READ_DATA;
  }

  // Decode.
  if (!DecodeImageData(dec, dec->pixels_, dec->width_, dec->height_,
                       io->crop_bottom, ProcessRows)) {
    goto Err;
  }

  params->last_y = dec->last_out_row_;
  return 1;

 Err:
  VP8LClear(dec);
  assert(dec->status_ != VP8_STATUS_OK);
  return 0;
}